

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCMakeInputs
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *this_00;
  pointer pcVar1;
  string *psVar2;
  Value *pVVar3;
  ValueHolder VVar4;
  Value result;
  string cmakeRootDir;
  ValueHolder local_e8 [2];
  long local_d8 [3];
  ValueHolder local_c0 [2];
  long local_b0 [2];
  Value local_a0;
  Value local_78;
  Value local_50;
  
  if ((int)this->m_State < 2) {
    local_e8[0].string_ = (char *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"This instance was not yet configured.","");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_e8);
    local_b0[0] = local_d8[0];
    VVar4 = local_e8[0];
    if (local_e8[0] == local_d8) {
      return __return_storage_ptr__;
    }
  }
  else {
    this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
              super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
              super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
              super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_c0[0].string_ = (char *)local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar1,pcVar1 + psVar2->_M_string_length);
    psVar2 = cmake::GetHomeDirectory_abi_cxx11_(this_00);
    Json::Value::Value((Value *)local_e8,objectValue);
    Json::Value::Value(&local_50,psVar2);
    pVVar3 = Json::Value::operator[]((Value *)local_e8,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_50);
    Json::Value::~Value(&local_50);
    Json::Value::Value(&local_78,(string *)local_c0);
    pVVar3 = Json::Value::operator[]((Value *)local_e8,&kCMAKE_ROOT_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_78);
    Json::Value::~Value(&local_78);
    cmDumpCMakeInputs(&local_a0,this_00);
    pVVar3 = Json::Value::operator[]((Value *)local_e8,&kBUILD_FILES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_a0);
    Json::Value::~Value(&local_a0);
    cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_e8);
    Json::Value::~Value((Value *)local_e8);
    VVar4 = local_c0[0];
    if (local_c0[0] == local_b0) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(VVar4.string_,local_b0[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCMakeInputs(
  const cmServerRequest& request)
{
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This instance was not yet configured.");
  }

  const cmake* cm = this->CMakeInstance();
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot();
  const std::string& sourceDir = cm->GetHomeDirectory();

  Json::Value result = Json::objectValue;
  result[kSOURCE_DIRECTORY_KEY] = sourceDir;
  result[kCMAKE_ROOT_DIRECTORY_KEY] = cmakeRootDir;
  result[kBUILD_FILES_KEY] = cmDumpCMakeInputs(cm);
  return request.Reply(result);
}